

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::(anonymous_namespace)::
sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (_anonymous_namespace_ *this,xpath_node *begin,xpath_node *end,
          document_order_comparator *pred)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  xpath_node *extraout_RDX;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *pxVar7;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *rhs;
  xpath_node *extraout_RDX_04;
  xpath_node *extraout_RDX_05;
  xpath_node *extraout_RDX_06;
  xpath_node *pxVar8;
  xpath_node *pxVar9;
  ulong uVar10;
  xpath_node *lhs;
  xpath_node *pxVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  xpath_node val;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  xpath_node *local_50;
  xpath_node *local_48;
  xpath_node *local_40;
  xpath_node *local_38;
  
  lVar12 = (long)begin - (long)this;
  do {
    if (lVar12 >> 4 < 0x21) {
      if (((xpath_node *)this != begin) &&
         (pxVar7 = (xpath_node *)((long)this + 0x10), pxVar7 != begin)) {
        lVar12 = 0;
        pxVar11 = pxVar7;
        do {
          local_68 = (pxVar11->_node)._root;
          pxStack_60 = (pxVar11->_attribute)._attr;
          bVar14 = anon_unknown_0::document_order_comparator::operator()
                             ((document_order_comparator *)&local_68,(xpath_node *)this,end);
          if (bVar14) {
            memmove(pxVar7,this,lVar12 * 0x10 + 0x10);
            end = extraout_RDX_04;
            pxVar8 = (xpath_node *)this;
          }
          else {
            bVar14 = anon_unknown_0::document_order_comparator::operator()
                               ((document_order_comparator *)&local_68,pxVar11 + -1,rhs);
            end = extraout_RDX_05;
            pxVar8 = pxVar11;
            while (bVar14 != false) {
              pxVar1 = pxVar8[-1]._attribute._attr;
              (pxVar8->_node)._root = pxVar8[-1]._node._root;
              (pxVar8->_attribute)._attr = pxVar1;
              bVar14 = anon_unknown_0::document_order_comparator::operator()
                                 ((document_order_comparator *)&local_68,pxVar8 + -2,end);
              end = extraout_RDX_06;
              pxVar8 = pxVar8 + -1;
            }
          }
          (pxVar8->_node)._root = local_68;
          (pxVar8->_attribute)._attr = pxStack_60;
          pxVar11 = pxVar11 + 1;
          lVar12 = lVar12 + 1;
        } while (pxVar11 != begin);
      }
      return;
    }
    uVar13 = (ulong)(lVar12 >> 4) >> 1;
    pxVar11 = (xpath_node *)((long)this + uVar13 * 0x10);
    pxVar7 = begin + -1;
    lVar12 = (long)pxVar7 - (long)this >> 4;
    pxVar8 = (xpath_node *)this;
    local_50 = begin;
    local_38 = begin;
    if (0x28 < lVar12) {
      uVar10 = lVar12 + 1U >> 3;
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((xpath_node *)this,(xpath_node *)((long)this + uVar10 * 0x10),
                 (xpath_node *)((long)this + uVar10 * 2 * 0x10),pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar11 + -uVar10,pxVar11,pxVar11 + uVar10,pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar7 + uVar10 * -2,pxVar7 + -uVar10,pxVar7,pred);
      pxVar7 = pxVar7 + -uVar10;
      pxVar8 = (xpath_node *)((long)this + uVar10 * 0x10);
    }
    median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (pxVar8,pxVar11,pxVar7,pred);
    lVar12 = uVar13 * 0x10;
    pxVar7 = extraout_RDX;
    do {
      lVar6 = lVar12;
      if ((lVar6 == 0) ||
         (*(long *)((long)&(((xpath_node *)((long)this + -0x10))->_node)._root + lVar6) !=
          *(long *)((long)&(((xpath_node *)this)->_node)._root + lVar6))) break;
      lVar12 = lVar6 + -0x10;
      pxVar7 = (xpath_node *)this;
    } while (*(long *)((long)this + lVar6 + -8) ==
             *(long *)((long)&(((xpath_node *)this)->_attribute)._attr + lVar6));
    begin = (xpath_node *)((long)&(((xpath_node *)this)->_node)._root + lVar6);
    pxVar11 = (xpath_node *)((long)this + uVar13 * 0x10);
    do {
      pxVar8 = pxVar11 + 1;
      lhs = pxVar8;
      local_48 = begin;
      if ((pxVar8 == local_50) || ((pxVar8->_node)._root != (begin->_node)._root)) break;
      pxVar9 = pxVar11 + 1;
      pxVar11 = pxVar8;
    } while ((pxVar9->_attribute)._attr == (begin->_attribute)._attr);
LAB_0011da51:
    pxVar11 = local_50;
    bVar14 = lhs == local_50;
    pxVar9 = local_48;
    if (!bVar14) {
      bVar14 = false;
      do {
        bVar4 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)begin,lhs,pxVar7);
        pxVar7 = extraout_RDX_00;
        pxVar9 = local_48;
        if (!bVar4) {
          if (((lhs->_node)._root != (begin->_node)._root) ||
             ((lhs->_attribute)._attr != (begin->_attribute)._attr)) break;
          local_68 = (lhs->_node)._root;
          pxStack_60 = (lhs->_attribute)._attr;
          pxVar1 = (pxVar8->_attribute)._attr;
          (lhs->_node)._root = (pxVar8->_node)._root;
          (lhs->_attribute)._attr = pxVar1;
          (pxVar8->_node)._root = local_68;
          (pxVar8->_attribute)._attr = pxStack_60;
          pxVar8 = pxVar8 + 1;
        }
        lhs = lhs + 1;
        bVar14 = lhs == pxVar11;
      } while (!bVar14);
    }
joined_r0x0011dabe:
    pxVar11 = pxVar9;
    local_40 = pxVar8;
    bVar4 = pxVar11 == (xpath_node *)this;
    if (!bVar4) {
      pxVar9 = pxVar11 + -1;
      bVar5 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar9,begin,pxVar7);
      pxVar7 = extraout_RDX_01;
      pxVar8 = local_40;
      if (!bVar5) {
        if (((begin->_node)._root != (pxVar9->_node)._root) ||
           ((begin->_attribute)._attr != pxVar11[-1]._attribute._attr)) goto LAB_0011db36;
        local_68 = (pxVar9->_node)._root;
        pxStack_60 = pxVar11[-1]._attribute._attr;
        pxVar1 = begin[-1]._attribute._attr;
        (pxVar9->_node)._root = begin[-1]._node._root;
        pxVar11[-1]._attribute._attr = pxVar1;
        begin[-1]._node._root = local_68;
        begin[-1]._attribute._attr = pxStack_60;
        begin = begin + -1;
      }
      goto joined_r0x0011dabe;
    }
LAB_0011db36:
    pxVar8 = local_40;
    if (!(bool)(bVar14 & bVar4)) {
      if (bVar14) {
        local_48 = pxVar11 + -1;
        pxVar9 = begin + -1;
        if (pxVar11 != begin) {
          pxVar2 = (local_48->_node)._root;
          pxVar1 = pxVar11[-1]._attribute._attr;
          pxVar3 = begin[-1]._attribute._attr;
          (local_48->_node)._root = (pxVar9->_node)._root;
          pxVar11[-1]._attribute._attr = pxVar3;
          (pxVar9->_node)._root = pxVar2;
          begin[-1]._attribute._attr = pxVar1;
        }
        local_68 = (pxVar9->_node)._root;
        pxStack_60 = begin[-1]._attribute._attr;
        pxVar1 = local_40[-1]._attribute._attr;
        (pxVar9->_node)._root = local_40[-1]._node._root;
        begin[-1]._attribute._attr = pxVar1;
        local_40[-1]._node._root = local_68;
        local_40[-1]._attribute._attr = pxStack_60;
        pxVar8 = local_40 + -1;
        begin = pxVar9;
      }
      else if (bVar4) {
        if (local_40 != lhs) {
          pxVar2 = (begin->_node)._root;
          pxVar1 = (begin->_attribute)._attr;
          pxVar3 = (local_40->_attribute)._attr;
          (begin->_node)._root = (local_40->_node)._root;
          (begin->_attribute)._attr = pxVar3;
          (local_40->_node)._root = pxVar2;
          (local_40->_attribute)._attr = pxVar1;
        }
        local_68 = (lhs->_node)._root;
        pxStack_60 = (lhs->_attribute)._attr;
        pxVar1 = (begin->_attribute)._attr;
        (lhs->_node)._root = (begin->_node)._root;
        (lhs->_attribute)._attr = pxVar1;
        (begin->_node)._root = local_68;
        (begin->_attribute)._attr = pxStack_60;
        pxVar8 = local_40 + 1;
        begin = begin + 1;
        lhs = lhs + 1;
        local_48 = pxVar11;
      }
      else {
        local_68 = (lhs->_node)._root;
        pxStack_60 = (lhs->_attribute)._attr;
        pxVar1 = pxVar11[-1]._attribute._attr;
        (lhs->_node)._root = pxVar11[-1]._node._root;
        (lhs->_attribute)._attr = pxVar1;
        pxVar11[-1]._node._root = local_68;
        pxVar11[-1]._attribute._attr = pxStack_60;
        lhs = lhs + 1;
        local_48 = pxVar11 + -1;
      }
      goto LAB_0011da51;
    }
    pred = (document_order_comparator *)((long)local_38 - (long)local_40);
    if ((long)pred < (long)begin - (long)this) {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((_anonymous_namespace_ *)local_40,local_50,pxVar7,pred);
      end = extraout_RDX_02;
      pxVar8 = (xpath_node *)this;
    }
    else {
      sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (this,begin,pxVar7,pred);
      end = extraout_RDX_03;
      begin = local_50;
    }
    lVar12 = (long)begin - (long)pxVar8;
    this = (_anonymous_namespace_ *)pxVar8;
  } while( true );
}

Assistant:

void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 32)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			median(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition(begin, middle, end, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		if (begin != end) insertion_sort(begin, end, pred, &*begin);
	}